

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadBodyMesh.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadBodyMesh::InputSimpleForces
          (ChLoadBodyMesh *this,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *vert_forces,
          vector<int,_std::allocator<int>_> *vert_ind)

{
  int iVar1;
  pointer pCVar2;
  ChLoadBodyForce *this_00;
  ulong uVar3;
  long local_88;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_68;
  shared_ptr<chrono::ChLoadBodyForce> mforce;
  ChVector<double> rel_application;
  
  if (((long)(vert_forces->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data._M_finish -
      (long)(vert_forces->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start) / 0x18 ==
      (long)(vert_ind->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(vert_ind->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2) {
    std::
    vector<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
    ::clear(&this->forces);
    local_88 = 0;
    for (uVar3 = 0;
        uVar3 < (ulong)(((long)(vert_forces->
                               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(vert_forces->
                              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                              )._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar3 = uVar3 + 1
        ) {
      pCVar2 = (this->contactmesh).m_vertices.
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar1 = (vert_ind->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar3];
      rel_application.m_data[0] = pCVar2[iVar1].m_data[0];
      rel_application.m_data[1] = pCVar2[iVar1].m_data[1];
      rel_application.m_data[2] = pCVar2[iVar1].m_data[2];
      this_00 = (ChLoadBodyForce *)::operator_new(0xb0);
      std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_68,
                 &(this->contactbody).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>
                );
      ChLoadBodyForce::ChLoadBodyForce
                (this_00,(shared_ptr<chrono::ChBody> *)&local_68,
                 (ChVector<double> *)
                 ((long)((vert_forces->
                         super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->m_data + local_88),false,
                 &rel_application,true);
      std::__shared_ptr<chrono::ChLoadBodyForce,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChLoadBodyForce,void>
                ((__shared_ptr<chrono::ChLoadBodyForce,(__gnu_cxx::_Lock_policy)2> *)&mforce,this_00
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
      std::
      vector<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
      ::push_back(&this->forces,(value_type *)&mforce);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mforce.super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      local_88 = local_88 + 0x18;
    }
    ChSystem::ForceUpdate
              ((((this->contactbody).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->super_ChPhysicsItem).system);
    return;
  }
  __assert_fail("vert_forces.size() == vert_ind.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLoadBodyMesh.cpp"
                ,0x2d,
                "void chrono::ChLoadBodyMesh::InputSimpleForces(const std::vector<ChVector<>>, const std::vector<int>)"
               );
}

Assistant:

void ChLoadBodyMesh::InputSimpleForces(
    const std::vector<ChVector<>> vert_forces,  // array of forces (absolute xyz forces in [N])
    const std::vector<int> vert_ind             // array of indexes to vertexes to whom you apply forces
) {
    // check the vert_forces and vert_ind arrays must have same size:
    assert(vert_forces.size() == vert_ind.size());
    // reset the previously applied forces if any:
    this->forces.clear();

    // Populate the array of applied loads to nodes
    for (size_t i = 0; i < vert_forces.size(); ++i) {
        ChVector<> rel_application = contactmesh.m_vertices[vert_ind[i]];

        std::shared_ptr<ChLoadBodyForce> mforce(
            new ChLoadBodyForce(contactbody, vert_forces[i], false, rel_application, true));
        this->forces.push_back(mforce);
    }

    // Force an update of the system containing the associated body
    contactbody->GetSystem()->ForceUpdate();
}